

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MDIOAnalyzerResults.cpp
# Opt level: O1

void __thiscall
MDIOAnalyzerResults::GenC45DevTypeString
          (MDIOAnalyzerResults *this,Frame *frame,DisplayBase display_base,char *devtype,
          bool tabular)

{
  undefined7 in_register_00000081;
  char number_str [128];
  char local_a8 [136];
  
  AnalyzerHelpers::GetNumberString(*(ulonglong *)(frame + 0x10),display_base,5,local_a8,0x80);
  if ((int)CONCAT71(in_register_00000081,tabular) == 0) {
    AnalyzerResults::AddResultString
              ((char *)this,"DEV",(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    AnalyzerResults::AddResultString((char *)this,"DEVTYPE[",devtype,"]",(char *)0x0,(char *)0x0);
  }
  AnalyzerResults::AddResultString((char *)this,"DEVTYPE [",devtype,"] - ",local_a8,(char *)0x0);
  return;
}

Assistant:

void MDIOAnalyzerResults::GenC45DevTypeString( const Frame& frame, DisplayBase display_base, const char* devtype, bool tabular )
{
    char number_str[ 128 ];
    AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 5, number_str, 128 );

    if( !tabular )
    {
        AddResultString( "DEV" );
        AddResultString( "DEVTYPE[", devtype, "]" );
    }
    AddResultString( "DEVTYPE [", devtype, "] - ", number_str );
}